

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

int lws_handle_POLLOUT_event(lws *wsi,pollfd *pollfd)

{
  uint uVar1;
  _func_int_lws_ptr *p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  wsi->leave_pollout_active = '\0';
  wsi->handling_pollout = '\x01';
  uVar6 = *(ulong *)&wsi->field_0x2dc & 0xfffffbffffffffff;
  *(ulong *)&wsi->field_0x2dc = uVar6;
  if (wsi->buflist_out == (lws_buflist *)0x0) {
    if ((short)wsi->wsistate == 0x11e) {
      *(ulong *)&wsi->field_0x2dc = uVar6 | 0x1000;
    }
    else {
      if (wsi->role_ops == (lws_role_ops *)0x0) {
        __assert_fail("wsi->role_ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                      ,0x90,"int lws_handle_POLLOUT_event(struct lws *, struct pollfd *)");
      }
      p_Var2 = wsi->role_ops->handle_POLLOUT;
      iVar5 = 0;
      if (p_Var2 == (_func_int_lws_ptr *)0x0) goto LAB_00113a73;
      iVar3 = (*p_Var2)(wsi);
      if (iVar3 - 2U < 2) {
        if (pollfd != (pollfd *)0x0) {
          if (wsi->leave_pollout_active == '\0') {
            iVar4 = lws_change_pollfd(wsi,4,0);
            if (iVar4 != 0) {
LAB_00113b70:
              _lws_log(8,"failed at set pollfd\n");
              goto LAB_00113a6d;
            }
            wsi->handling_pollout = '\0';
            if (wsi->leave_pollout_active != '\0') {
              _lws_log(0x10,"leave_pollout_active\n");
              iVar4 = lws_change_pollfd(wsi,0,4);
              if (iVar4 != 0) goto LAB_00113b70;
            }
          }
          else {
            wsi->handling_pollout = '\0';
          }
          wsi->leave_pollout_active = '\0';
        }
        uVar1 = wsi->wsistate;
        if ((((uVar1 >> 0x1c & 1) == 0) || ((wsi->field_0x2dc & 1) != 0)) ||
           ((uVar1 & 0xffff) == 0x10f)) {
          if (iVar3 == 3) goto LAB_00113a73;
        }
        else if ((iVar3 == 3) || ((uVar1 & 0xffff) != 0x14)) goto LAB_00113a73;
        p_Var2 = wsi->role_ops->perform_user_POLLOUT;
        if (p_Var2 == (_func_int_lws_ptr *)0x0) {
          _lws_log(0x10,"%s: %p: non mux: wsistate 0x%lx, ops %s\n","lws_handle_POLLOUT_event",wsi,
                   (ulong)uVar1,wsi->role_ops->name);
          wsi->leave_pollout_active = '\0';
          iVar5 = lws_callback_as_writeable(wsi);
          wsi->handling_pollout = '\0';
          if (wsi->leave_pollout_active == '\0') {
            return iVar5;
          }
          iVar3 = lws_change_pollfd(wsi,0,4);
          if (iVar3 == 0) {
            return iVar5;
          }
        }
        else {
          iVar3 = (*p_Var2)(wsi);
          if (iVar3 != -1) goto LAB_00113a73;
        }
      }
      else {
        iVar5 = iVar3;
        if (iVar3 == 0) goto LAB_00113a73;
        if (iVar3 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                        ,0x9f,"int lws_handle_POLLOUT_event(struct lws *, struct pollfd *)");
        }
      }
    }
  }
  else {
    iVar3 = lws_issue_raw(wsi,(uchar *)0x0,0);
    iVar5 = 0;
    if (-1 < iVar3) goto LAB_00113a73;
    _lws_log(8,"%s signalling to close\n","lws_handle_POLLOUT_event");
  }
LAB_00113a6d:
  iVar5 = -1;
LAB_00113a73:
  wsi->handling_pollout = '\0';
  wsi->leave_pollout_active = '\0';
  return iVar5;
}

Assistant:

int
lws_handle_POLLOUT_event(struct lws *wsi, struct lws_pollfd *pollfd)
{
	volatile struct lws *vwsi = (volatile struct lws *)wsi;
	int n;

	// lwsl_notice("%s: %p\n", __func__, wsi);

	vwsi->leave_pollout_active = 0;
	vwsi->handling_pollout = 1;
	/*
	 * if another thread wants POLLOUT on us, from here on while
	 * handling_pollout is set, he will only set leave_pollout_active.
	 * If we are going to disable POLLOUT, we will check that first.
	 */
	wsi->could_have_pending = 0; /* clear back-to-back write detection */

	/*
	 * user callback is lowest priority to get these notifications
	 * actually, since other pending things cannot be disordered
	 *
	 * Priority 1: pending truncated sends are incomplete ws fragments
	 *	       If anything else sent first the protocol would be
	 *	       corrupted.
	 *
	 *	       These are post- any compression transform
	 */

	if (lws_has_buffered_out(wsi)) {
		//lwsl_notice("%s: completing partial\n", __func__);
		if (lws_issue_raw(wsi, NULL, 0) < 0) {
			lwsl_info("%s signalling to close\n", __func__);
			goto bail_die;
		}
		/* leave POLLOUT active either way */
		goto bail_ok;
	} else
		if (lwsi_state(wsi) == LRS_FLUSHING_BEFORE_CLOSE) {
			wsi->socket_is_permanently_unusable = 1;
			goto bail_die; /* retry closing now */
		}

	/* Priority 2: pre- compression transform */

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	if (wsi->http.comp_ctx.buflist_comp ||
	    wsi->http.comp_ctx.may_have_more) {
		enum lws_write_protocol wp = LWS_WRITE_HTTP;

		lwsl_info("%s: completing comp partial (buflist_comp %p, may %d)\n",
				__func__, wsi->http.comp_ctx.buflist_comp,
				wsi->http.comp_ctx.may_have_more
				);

		if (wsi->role_ops->write_role_protocol(wsi, NULL, 0, &wp) < 0) {
			lwsl_info("%s signalling to close\n", __func__);
			goto bail_die;
		}
		lws_callback_on_writable(wsi);

		goto bail_ok;
	}
#endif

#ifdef LWS_WITH_CGI
	/*
	 * A cgi master's wire protocol remains h1 or h2.  He is just getting
	 * his data from his child cgis.
	 */
	if (wsi->http.cgi) {
		/* also one shot */
		if (pollfd)
			if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
				lwsl_info("failed at set pollfd\n");
				return 1;
			}
		goto user_service_go_again;
	}
#endif

	/* if we got here, we should have wire protocol ops set on the wsi */
	assert(wsi->role_ops);

	if (!wsi->role_ops->handle_POLLOUT)
		goto bail_ok;

	n = wsi->role_ops->handle_POLLOUT(wsi);
	switch (n) {
	case LWS_HP_RET_BAIL_OK:
		goto bail_ok;
	case LWS_HP_RET_BAIL_DIE:
		goto bail_die;
	case LWS_HP_RET_DROP_POLLOUT:
	case LWS_HP_RET_USER_SERVICE:
		break;
	default:
		assert(0);
	}

	/* one shot */

	if (pollfd) {
		int eff = vwsi->leave_pollout_active;

		if (!eff) {
			if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
				lwsl_info("failed at set pollfd\n");
				goto bail_die;
			}
		}

		vwsi->handling_pollout = 0;

		/* cannot get leave_pollout_active set after the above */
		if (!eff && wsi->leave_pollout_active) {
			/*
			 * got set inbetween sampling eff and clearing
			 * handling_pollout, force POLLOUT on
			 */
			lwsl_debug("leave_pollout_active\n");
			if (lws_change_pollfd(wsi, 0, LWS_POLLOUT)) {
				lwsl_info("failed at set pollfd\n");
				goto bail_die;
			}
		}

		vwsi->leave_pollout_active = 0;
	}

	if (lwsi_role_client(wsi) && !wsi->hdr_parsing_completed &&
	     lwsi_state(wsi) != LRS_H2_WAITING_TO_SEND_HEADERS &&
	     lwsi_state(wsi) != LRS_ISSUE_HTTP_BODY)
		goto bail_ok;

	if (n == LWS_HP_RET_DROP_POLLOUT)
		goto bail_ok;


#ifdef LWS_WITH_CGI
user_service_go_again:
#endif

	if (wsi->role_ops->perform_user_POLLOUT) {
		if (wsi->role_ops->perform_user_POLLOUT(wsi) == -1)
			goto bail_die;
		else
			goto bail_ok;
	}

	lwsl_debug("%s: %p: non mux: wsistate 0x%lx, ops %s\n", __func__, wsi,
		   (unsigned long)wsi->wsistate, wsi->role_ops->name);

	vwsi = (volatile struct lws *)wsi;
	vwsi->leave_pollout_active = 0;

	n = lws_callback_as_writeable(wsi);
	vwsi->handling_pollout = 0;

	if (vwsi->leave_pollout_active)
		if (lws_change_pollfd(wsi, 0, LWS_POLLOUT))
			goto bail_die;

	return n;

	/*
	 * since these don't disable the POLLOUT, they are always doing the
	 * right thing for leave_pollout_active whether it was set or not.
	 */

bail_ok:
	vwsi->handling_pollout = 0;
	vwsi->leave_pollout_active = 0;

	return 0;

bail_die:
	vwsi->handling_pollout = 0;
	vwsi->leave_pollout_active = 0;

	return -1;
}